

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O1

void __thiscall
cmExtraEclipseCDT4Generator::CreateSourceProjectFile(cmExtraEclipseCDT4Generator *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  size_t __n;
  pointer pcVar3;
  int iVar4;
  string filename;
  cmXMLWriter xml;
  string name;
  cmGeneratedFileStream fout;
  string local_320;
  string local_300;
  undefined1 local_2e0 [88];
  string local_288;
  undefined1 local_268 [32];
  byte abStack_248 [552];
  
  __n = (this->HomeDirectory)._M_string_length;
  if (__n == (this->HomeOutputDirectory)._M_string_length) {
    if (__n != 0) {
      iVar4 = bcmp((this->HomeDirectory)._M_dataplus._M_p,
                   (this->HomeOutputDirectory)._M_dataplus._M_p,__n);
      if (iVar4 != 0) goto LAB_002b86f1;
    }
    __assert_fail("this->HomeDirectory != this->HomeOutputDirectory",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmExtraEclipseCDT4Generator.cxx"
                  ,0xab,"void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()");
  }
LAB_002b86f1:
  cmLocalGenerator::GetProjectName_abi_cxx11_
            ((string *)local_268,
             *(((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start);
  local_2e0._0_8_ = local_2e0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_2e0,"Source","");
  GetPathBasename(&local_300,&this->HomeDirectory);
  GenerateProjectName(&local_288,(string *)local_268,(string *)local_2e0,&local_300);
  paVar1 = &local_300.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_2e0._0_8_ != local_2e0 + 0x10) {
    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
  }
  if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
    operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
  }
  pcVar3 = (this->HomeDirectory)._M_dataplus._M_p;
  local_300._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_300,pcVar3,pcVar3 + (this->HomeDirectory)._M_string_length);
  std::__cxx11::string::append((char *)&local_300);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_268,&local_300,false,None);
  if ((abStack_248[*(long *)(local_268._0_8_ + -0x18)] & 5) == 0) {
    cmXMLWriter::cmXMLWriter((cmXMLWriter *)local_2e0,(ostream *)local_268,0);
    cmXMLWriter::StartDocument((cmXMLWriter *)local_2e0,"UTF-8");
    paVar2 = &local_320.field_2;
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"projectDescription","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"name","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    cmXMLWriter::Content<std::__cxx11::string>((cmXMLWriter *)local_2e0,&local_288);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"comment","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_2e0,(char (*) [1])0x4ecdb2);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"projects","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_2e0,(char (*) [1])0x4ecdb2);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"buildSpec","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_2e0,(char (*) [1])0x4ecdb2);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"natures","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    cmXMLWriter::Content<char[1]>((cmXMLWriter *)local_2e0,(char (*) [1])0x4ecdb2);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    local_320._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_320,"linkedResources","");
    cmXMLWriter::StartElement((cmXMLWriter *)local_2e0,&local_320);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_320._M_dataplus._M_p != paVar2) {
      operator_delete(local_320._M_dataplus._M_p,local_320.field_2._M_allocated_capacity + 1);
    }
    if (this->SupportsVirtualFolders == true) {
      CreateLinksToSubprojects(this,(cmXMLWriter *)local_2e0,&this->HomeDirectory);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end(&this->SrcLinkedResources,
                        (this->SrcLinkedResources).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start);
    }
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndElement((cmXMLWriter *)local_2e0);
    cmXMLWriter::EndDocument((cmXMLWriter *)local_2e0);
    cmXMLWriter::~cmXMLWriter((cmXMLWriter *)local_2e0);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_268);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_300._M_dataplus._M_p != paVar1) {
    operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288._M_dataplus._M_p != &local_288.field_2) {
    operator_delete(local_288._M_dataplus._M_p,local_288.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateSourceProjectFile()
{
  assert(this->HomeDirectory != this->HomeOutputDirectory);

  // set up the project name: <project>-Source@<baseSourcePathName>
  cmLocalGenerator* lg = this->GlobalGenerator->GetLocalGenerators()[0];
  std::string name = cmExtraEclipseCDT4Generator::GenerateProjectName(
    lg->GetProjectName(), "Source",
    cmExtraEclipseCDT4Generator::GetPathBasename(this->HomeDirectory));

  const std::string filename = this->HomeDirectory + "/.project";
  cmGeneratedFileStream fout(filename);
  if (!fout) {
    return;
  }

  cmXMLWriter xml(fout);
  xml.StartDocument("UTF-8");
  xml.StartElement("projectDescription");
  xml.Element("name", name);
  xml.Element("comment", "");
  xml.Element("projects", "");
  xml.Element("buildSpec", "");
  xml.Element("natures", "");
  xml.StartElement("linkedResources");

  if (this->SupportsVirtualFolders) {
    this->CreateLinksToSubprojects(xml, this->HomeDirectory);
    this->SrcLinkedResources.clear();
  }

  xml.EndElement(); // linkedResources
  xml.EndElement(); // projectDescription
  xml.EndDocument();
}